

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::
     encode_traits<std::vector<std::tuple<std::__cxx11::string,int>,std::allocator<std::tuple<std::__cxx11::string,int>>>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  bool bVar1;
  basic_json_visitor<char> *pbVar2;
  error_code *in_RCX;
  ser_context *in_RSI;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_RDI;
  const_iterator it;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *in_stack_ffffffffffffff90;
  ser_context *length;
  basic_json_visitor<char> local_50;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_48;
  __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  local_40;
  error_code *in_stack_ffffffffffffffc8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  ser_context encoder_00;
  
  length = in_RSI;
  pbVar2 = (basic_json_visitor<char> *)
           std::
           vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::size(in_RDI);
  encoder_00._vptr_ser_context = (_func_int **)0x0;
  ser_context::ser_context((ser_context *)&stack0xffffffffffffffd8);
  basic_json_visitor<char>::begin_array
            (pbVar2,(size_t)length,(semantic_tag)((ulong)in_stack_ffffffffffffff90 >> 0x38),
             (ser_context *)in_stack_ffffffffffffff88,(error_code *)0x4a8884);
  ser_context::~ser_context((ser_context *)&stack0xffffffffffffffd8);
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (!bVar1) {
    local_40._M_current =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)std::
            begin<std::vector<std::tuple<std::__cxx11::string,int>,std::allocator<std::tuple<std::__cxx11::string,int>>>>
                      (in_stack_ffffffffffffff88);
    while( true ) {
      local_48 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)std::
                    end<std::vector<std::tuple<std::__cxx11::string,int>,std::allocator<std::tuple<std::__cxx11::string,int>>>>
                              (in_stack_ffffffffffffff88);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff90,
                         (__normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::operator*(&local_40);
      encode_traits<std::tuple<std::__cxx11::string,int>,char,void>::
      encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ((value_type *)in_RCX,(basic_json_visitor<char> *)encoder_00._vptr_ser_context,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
      if (bVar1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::operator++(&local_40);
    }
    local_50._vptr_basic_json_visitor = (_func_int **)0x0;
    pbVar2 = &local_50;
    ser_context::ser_context((ser_context *)pbVar2);
    basic_json_visitor<char>::end_array(pbVar2,in_RSI,(error_code *)0x4a8972);
    ser_context::~ser_context((ser_context *)&local_50);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(val.size(),semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encode_traits<value_type,CharT>::encode(*it, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_array(ser_context(), ec);
        }